

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O2

void __thiscall phosg::Subprocess::Subprocess(Subprocess *this,Subprocess *other)

{
  int iVar1;
  int iVar2;
  pid_t pVar3;
  
  iVar1 = other->stdout_read_fd;
  iVar2 = other->stderr_read_fd;
  pVar3 = other->child_pid;
  this->stdin_write_fd = other->stdin_write_fd;
  this->stdout_read_fd = iVar1;
  this->stderr_read_fd = iVar2;
  this->child_pid = pVar3;
  this->terminated = other->terminated;
  this->exit_status = other->exit_status;
  other->stdin_write_fd = -1;
  other->stdout_read_fd = -1;
  other->stderr_read_fd = -1;
  other->child_pid = -1;
  other->terminated = true;
  return;
}

Assistant:

Subprocess::Subprocess(Subprocess&& other)
    : stdin_write_fd(other.stdin_write_fd),
      stdout_read_fd(other.stdout_read_fd),
      stderr_read_fd(other.stderr_read_fd),
      child_pid(other.child_pid),
      terminated(other.terminated),
      exit_status(other.exit_status) {
  other.stdin_write_fd = -1;
  other.stdout_read_fd = -1;
  other.stderr_read_fd = -1;
  other.child_pid = -1;
  other.terminated = true;
}